

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_create(REF_INTERP *ref_interp_ptr,REF_GRID from_grid,REF_GRID to_grid)

{
  uint uVar1;
  REF_MPI pRVar2;
  REF_BOOL *pRVar3;
  REF_INT *pRVar4;
  REF_DBL *pRVar5;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG nqua;
  REF_INTERP pRStack_30;
  REF_INT max;
  REF_INTERP ref_interp;
  REF_GRID to_grid_local;
  REF_GRID from_grid_local;
  REF_INTERP *ref_interp_ptr_local;
  
  nqua._4_4_ = to_grid->node->max;
  ref_interp = (REF_INTERP)to_grid;
  to_grid_local = from_grid;
  from_grid_local = (REF_GRID)ref_interp_ptr;
  pRVar2 = (REF_MPI)malloc(0xb0);
  from_grid_local->mpi = pRVar2;
  if (from_grid_local->mpi == (REF_MPI)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x98,
           "ref_interp_create","malloc *ref_interp_ptr of REF_INTERP_STRUCT NULL");
    ref_interp_ptr_local._4_4_ = 2;
  }
  else {
    pRStack_30 = (REF_INTERP)from_grid_local->mpi;
    pRStack_30->from_grid = to_grid_local;
    uVar1 = ref_cell_ncell(to_grid_local->cell[6],to_grid_local->node,&npyr);
    if (uVar1 == 0) {
      uVar1 = ref_cell_ncell(to_grid_local->cell[9],to_grid_local->node,&npri);
      if (uVar1 == 0) {
        uVar1 = ref_cell_ncell(to_grid_local->cell[10],to_grid_local->node,&nhex);
        if (uVar1 == 0) {
          uVar1 = ref_cell_ncell(to_grid_local->cell[0xb],to_grid_local->node,
                                 (REF_LONG *)&ref_private_macro_code_rss_1);
          if (uVar1 == 0) {
            if ((((npyr < 1) && (npri < 1)) && (nhex < 1)) && (_ref_private_macro_code_rss_1 < 1)) {
              pRStack_30->from_tet = to_grid_local->cell[8];
              pRStack_30->from_tri = to_grid_local->cell[3];
              pRStack_30->from_cell_freeable = 0;
            }
            else {
              uVar1 = ref_shard_extract_tri(to_grid_local,&pRStack_30->from_tri);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0xa6,"ref_interp_create",(ulong)uVar1,"shard tri");
                return uVar1;
              }
              uVar1 = ref_shard_extract_tet(to_grid_local,&pRStack_30->from_tet);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0xa8,"ref_interp_create",(ulong)uVar1,"shard tet");
                return uVar1;
              }
              pRStack_30->from_cell_freeable = 1;
            }
            pRStack_30->to_grid = (REF_GRID)ref_interp;
            pRStack_30->ref_mpi = pRStack_30->from_grid->mpi;
            pRStack_30->instrument = 0;
            pRStack_30->continuously = 0;
            pRStack_30->n_walk = 0;
            pRStack_30->n_terminated = 0;
            pRStack_30->walk_steps = 0;
            pRStack_30->n_geom = 0;
            pRStack_30->n_geom_fail = 0;
            pRStack_30->n_tree = 0;
            pRStack_30->tree_cells = 0;
            pRStack_30->max = nqua._4_4_;
            if (nqua._4_4_ < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xbd,"ref_interp_create","malloc ref_interp->agent_hired of REF_BOOL negative"
                    );
              ref_interp_ptr_local._4_4_ = 1;
            }
            else {
              pRVar3 = (REF_BOOL *)malloc((long)nqua._4_4_ << 2);
              pRStack_30->agent_hired = pRVar3;
              if (pRStack_30->agent_hired == (REF_BOOL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0xbd,"ref_interp_create","malloc ref_interp->agent_hired of REF_BOOL NULL");
                ref_interp_ptr_local._4_4_ = 2;
              }
              else {
                for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < nqua._4_4_;
                    ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
                  pRStack_30->agent_hired[ref_malloc_init_i_2] = 0;
                }
                if (nqua._4_4_ < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0xbe,"ref_interp_create","malloc ref_interp->cell of REF_INT negative");
                  ref_interp_ptr_local._4_4_ = 1;
                }
                else {
                  pRVar4 = (REF_INT *)malloc((long)nqua._4_4_ << 2);
                  pRStack_30->cell = pRVar4;
                  if (pRStack_30->cell == (REF_INT *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xbe,"ref_interp_create","malloc ref_interp->cell of REF_INT NULL");
                    ref_interp_ptr_local._4_4_ = 2;
                  }
                  else {
                    for (ref_private_macro_code_rss_6 = 0; ref_private_macro_code_rss_6 < nqua._4_4_
                        ; ref_private_macro_code_rss_6 = ref_private_macro_code_rss_6 + 1) {
                      pRStack_30->cell[ref_private_macro_code_rss_6] = -1;
                    }
                    if (nqua._4_4_ < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xbf,"ref_interp_create","malloc ref_interp->part of REF_INT negative"
                            );
                      ref_interp_ptr_local._4_4_ = 1;
                    }
                    else {
                      pRVar4 = (REF_INT *)malloc((long)nqua._4_4_ << 2);
                      pRStack_30->part = pRVar4;
                      if (pRStack_30->part == (REF_INT *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0xbf,"ref_interp_create","malloc ref_interp->part of REF_INT NULL");
                        ref_interp_ptr_local._4_4_ = 2;
                      }
                      else {
                        for (ref_private_macro_code_rss_7 = 0;
                            ref_private_macro_code_rss_7 < nqua._4_4_;
                            ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
                          pRStack_30->part[ref_private_macro_code_rss_7] = -1;
                        }
                        if (nqua._4_4_ * 4 < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0xc0,"ref_interp_create",
                                 "malloc ref_interp->bary of REF_DBL negative");
                          ref_interp_ptr_local._4_4_ = 1;
                        }
                        else {
                          pRVar5 = (REF_DBL *)malloc((long)(nqua._4_4_ << 2) << 3);
                          pRStack_30->bary = pRVar5;
                          if (pRStack_30->bary == (REF_DBL *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0xc0,"ref_interp_create",
                                   "malloc ref_interp->bary of REF_DBL NULL");
                            ref_interp_ptr_local._4_4_ = 2;
                          }
                          else {
                            pRStack_30->inside = -1e-12;
                            pRStack_30->bound = -0.1;
                            uVar1 = ref_agents_create(&pRStack_30->ref_agents,pRStack_30->ref_mpi);
                            if (uVar1 == 0) {
                              uVar1 = ref_list_create(&pRStack_30->visualize);
                              if (uVar1 == 0) {
                                pRStack_30->search_fuzz = 1e-12;
                                pRStack_30->search_donor_scale = 2.0;
                                ref_interp_ptr_local._4_4_ = ref_interp_create_search(pRStack_30);
                                if (ref_interp_ptr_local._4_4_ == 0) {
                                  ref_interp_ptr_local._4_4_ = 0;
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0xc9,"ref_interp_create",(ulong)ref_interp_ptr_local._4_4_
                                         ,"fill search");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0xc6,"ref_interp_create",(ulong)uVar1,"add list");
                                ref_interp_ptr_local._4_4_ = uVar1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0xc5,"ref_interp_create",(ulong)uVar1,"add agents");
                              ref_interp_ptr_local._4_4_ = uVar1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xa3,"ref_interp_create",(ulong)uVar1,"global nhex");
            ref_interp_ptr_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xa1,"ref_interp_create",(ulong)uVar1,"global npri");
          ref_interp_ptr_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x9f,"ref_interp_create",(ulong)uVar1,"global npyr");
        ref_interp_ptr_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x9d
             ,"ref_interp_create",(ulong)uVar1,"global nqua");
      ref_interp_ptr_local._4_4_ = uVar1;
    }
  }
  return ref_interp_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create(REF_INTERP *ref_interp_ptr,
                                     REF_GRID from_grid, REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_INT max = ref_node_max(ref_grid_node(to_grid));
  REF_LONG nqua, npyr, npri, nhex;

  ref_malloc(*ref_interp_ptr, 1, REF_INTERP_STRUCT);
  ref_interp = (*ref_interp_ptr);

  ref_interp_from_grid(ref_interp) = from_grid;
  RSS(ref_cell_ncell(ref_grid_qua(from_grid), ref_grid_node(from_grid), &nqua),
      "global nqua");
  RSS(ref_cell_ncell(ref_grid_pyr(from_grid), ref_grid_node(from_grid), &npyr),
      "global npyr");
  RSS(ref_cell_ncell(ref_grid_pri(from_grid), ref_grid_node(from_grid), &npri),
      "global npri");
  RSS(ref_cell_ncell(ref_grid_hex(from_grid), ref_grid_node(from_grid), &nhex),
      "global nhex");
  if (0 < nqua || 0 < npyr || 0 < npri || 0 < nhex) {
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    ref_interp_from_cell_freeable(ref_interp) = REF_TRUE;
  } else {
    ref_interp_from_tet(ref_interp) = ref_grid_tet(from_grid);
    ref_interp_from_tri(ref_interp) = ref_grid_tri(from_grid);
    ref_interp_from_cell_freeable(ref_interp) = REF_FALSE;
  }
  ref_interp_to_grid(ref_interp) = to_grid;

  ref_interp_mpi(ref_interp) = ref_grid_mpi(ref_interp_from_grid(ref_interp));

  ref_interp->instrument = REF_FALSE;
  ref_interp->continuously = REF_FALSE;
  ref_interp->n_walk = 0;
  ref_interp->n_terminated = 0;
  ref_interp->walk_steps = 0;
  ref_interp->n_geom = 0;
  ref_interp->n_geom_fail = 0;
  ref_interp->n_tree = 0;
  ref_interp->tree_cells = 0;
  ref_interp_max(ref_interp) = max;
  ref_malloc_init(ref_interp->agent_hired, max, REF_BOOL, REF_FALSE);
  ref_malloc_init(ref_interp->cell, max, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_interp->part, max, REF_INT, REF_EMPTY);
  ref_malloc(ref_interp->bary, 4 * max, REF_DBL);
  ref_interp->inside = -1.0e-12; /* inside tolerance */
  ref_interp->bound = -0.1;      /* bound tolerance */

  RSS(ref_agents_create(&(ref_interp->ref_agents), ref_interp_mpi(ref_interp)),
      "add agents");
  RSS(ref_list_create(&(ref_interp->visualize)), "add list");
  ref_interp_search_fuzz(ref_interp) = 1.0e-12;
  ref_interp_search_donor_scale(ref_interp) = 2.0;
  RSS(ref_interp_create_search(ref_interp), "fill search");

  return REF_SUCCESS;
}